

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::pipeline::anon_unknown_0::SimpleGraphicsPipelineBuilder::buildPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          SimpleGraphicsPipelineBuilder *this,UVec2 *renderSize,VkRenderPass renderPass,
          VkPipelineCache cache,VkPipelineLayout pipelineLayout)

{
  uint uVar1;
  DeviceInterface *vk_00;
  VkDevice device;
  uint *puVar2;
  VkPipelineInputAssemblyStateCreateInfo *local_330;
  undefined1 local_300 [8];
  VkGraphicsPipelineCreateInfo graphicsPipelineParams;
  VkPipelineTessellationStateCreateInfo *pTessCreateInfo;
  VkPipelineTessellationStateCreateInfo tessStateCreateInfo;
  VkPipelineDepthStencilStateCreateInfo depthStencilStateParams;
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  VkPipelineColorBlendStateCreateInfo colorBlendStateParams;
  VkPipelineColorBlendAttachmentState colorBlendAttachmentState;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkDevice vkDevice;
  DeviceInterface *vk;
  UVec2 *renderSize_local;
  SimpleGraphicsPipelineBuilder_conflict *this_local;
  VkPipelineLayout pipelineLayout_local;
  VkPipelineCache cache_local;
  VkRenderPass renderPass_local;
  
  vk_00 = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0x20;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R4G4_UNORM_PACK8;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0x6d;
  vertexInputAttributeDescriptions[1].binding = 0x10;
  vertexInputStateParams.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexInputAttributeDescriptions[0].location = 0x6d;
  vertexInputAttributeDescriptions[0].binding = 0;
  inputAssemblyStateParams.primitiveRestartEnable = 0x13;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateParams._4_4_ = 0;
  vertexInputStateParams.pNext._0_4_ = 0;
  vertexInputStateParams.pNext._4_4_ = 1;
  vertexInputStateParams._16_8_ = &vertexInputAttributeDescriptions[1].format;
  vertexInputStateParams.pVertexBindingDescriptions._0_4_ = 2;
  vertexInputStateParams._32_8_ = &vertexInputStateParams.pVertexAttributeDescriptions;
  inputAssemblyStateParams.flags = 0;
  inputAssemblyStateParams.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  viewport.minDepth = 2.8026e-44;
  viewport.maxDepth = 0.0;
  uVar1 = 10;
  if (this->m_patchControlPoints == 0) {
    uVar1 = 3;
  }
  inputAssemblyStateParams.pNext = (void *)((ulong)uVar1 << 0x20);
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  puVar2 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  viewport.x = (float)*puVar2;
  puVar2 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  viewport.y = (float)*puVar2;
  viewport.width = 0.0;
  viewport.height = 1.0;
  viewportStateParams.pScissors._0_4_ = 0;
  viewportStateParams.pScissors._4_4_ = 0;
  puVar2 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  scissor.offset.x = *puVar2;
  puVar2 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  scissor.offset.y = *puVar2;
  rasterStateParams.lineWidth = 3.08286e-44;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportStateParams._4_4_ = 0;
  viewportStateParams.pNext._0_4_ = 0;
  viewportStateParams.pNext._4_4_ = 1;
  viewportStateParams._16_8_ = &scissor.extent;
  viewportStateParams.pViewports._0_4_ = 1;
  viewportStateParams._32_8_ = &viewportStateParams.pScissors;
  memset(&colorBlendAttachmentState.alphaBlendOp,0,0x40);
  colorBlendAttachmentState.alphaBlendOp = 0x17;
  rasterStateParams.depthBiasClamp = 1.0;
  colorBlendStateParams.blendConstants[2] = 0.0;
  colorBlendStateParams.blendConstants[3] = 1.4013e-45;
  colorBlendAttachmentState.blendEnable = 0;
  colorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  colorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
  colorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  colorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  colorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  multisampleStateParams.alphaToCoverageEnable = 0x1a;
  colorBlendStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorBlendStateParams._4_4_ = 0;
  colorBlendStateParams.pNext._0_4_ = 0;
  colorBlendStateParams.pNext._4_4_ = 0;
  colorBlendStateParams.flags = 3;
  colorBlendStateParams.logicOpEnable = 1;
  colorBlendStateParams._24_8_ = colorBlendStateParams.blendConstants + 2;
  colorBlendStateParams.pAttachments._0_4_ = 0;
  colorBlendStateParams.pAttachments._4_4_ = 0;
  colorBlendStateParams.blendConstants[0] = 0.0;
  colorBlendStateParams.blendConstants[1] = 0.0;
  memset(&depthStencilStateParams.minDepthBounds,0,0x30);
  depthStencilStateParams.minDepthBounds = 3.36312e-44;
  multisampleStateParams.pNext._4_4_ = 1;
  memset(&tessStateCreateInfo.flags,0,0x68);
  tessStateCreateInfo.flags = 0x19;
  depthStencilStateParams.pNext._4_4_ = 1;
  depthStencilStateParams.flags = 1;
  depthStencilStateParams.depthTestEnable = 3;
  depthStencilStateParams.back.reference = 0x3f800000;
  pTessCreateInfo._0_4_ = 0x15;
  tessStateCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  tessStateCreateInfo._4_4_ = 0;
  tessStateCreateInfo.pNext._0_4_ = 0;
  tessStateCreateInfo.pNext._4_4_ = this->m_patchControlPoints;
  if (this->m_patchControlPoints == 0) {
    local_330 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  else {
    local_330 = (VkPipelineInputAssemblyStateCreateInfo *)&pTessCreateInfo;
  }
  graphicsPipelineParams._136_8_ = local_330;
  local_300._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  graphicsPipelineParams._4_4_ = 0;
  graphicsPipelineParams.pNext._0_4_ = 0;
  graphicsPipelineParams.pNext._4_4_ = this->m_shaderStageCount;
  graphicsPipelineParams._16_8_ = this->m_shaderStageInfo;
  graphicsPipelineParams.pStages =
       (VkPipelineShaderStageCreateInfo *)&inputAssemblyStateParams.primitiveRestartEnable;
  graphicsPipelineParams.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&viewport.minDepth;
  graphicsPipelineParams.pInputAssemblyState = local_330;
  graphicsPipelineParams.pTessellationState =
       (VkPipelineTessellationStateCreateInfo *)&rasterStateParams.lineWidth;
  graphicsPipelineParams.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&colorBlendAttachmentState.alphaBlendOp;
  graphicsPipelineParams.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&depthStencilStateParams.minDepthBounds;
  graphicsPipelineParams.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)&tessStateCreateInfo.flags;
  graphicsPipelineParams.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&multisampleStateParams.alphaToCoverageEnable;
  graphicsPipelineParams.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  graphicsPipelineParams.renderPass.m_internal._0_4_ = 0;
  graphicsPipelineParams.pDynamicState =
       (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal;
  graphicsPipelineParams.layout.m_internal = renderPass.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&graphicsPipelineParams.subpass,0);
  graphicsPipelineParams.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk_00,device,cache,(VkGraphicsPipelineCreateInfo *)local_300,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> SimpleGraphicsPipelineBuilder::buildPipeline (tcu::UVec2 renderSize, VkRenderPass renderPass, VkPipelineCache cache, VkPipelineLayout pipelineLayout)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();

	// Create pipeline
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,                                 // deUint32                 binding;
		sizeof(Vertex4RGBA),                // deUint32                 strideInBytes;
		VK_VERTEX_INPUT_RATE_VERTEX,        // VkVertexInputRate        inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
	{
		{
			0u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			0u                                  // deUint32 offsetInBytes;
		},
		{
			1u,                                 // deUint32 location;
			0u,                                 // deUint32 binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,      // VkFormat format;
			DE_OFFSET_OF(Vertex4RGBA, color),   // deUint32 offsetInBytes;
		}
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,      // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineVertexInputStateCreateFlags    flags;
		1u,                                                             // deUint32                                 vertexBindingDescriptionCount;
		&vertexInputBindingDescription,                                 // const VkVertexInputBindingDescription*   pVertexBindingDescriptions;
		2u,                                                             // deUint32                                 vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,                               // const VkVertexInputAttributeDescription* pVertexAttributeDescriptions;
	};

	const VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,    // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineInputAssemblyStateCreateFlags  flags;
		(m_patchControlPoints == 0 ? VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST
								   : VK_PRIMITIVE_TOPOLOGY_PATCH_LIST), // VkPrimitiveTopology                      topology;
		VK_FALSE,                                                       // VkBool32                                 primitiveRestartEnable;
	};

	const VkViewport viewport =
	{
		0.0f,                       // float    originX;
		0.0f,                       // float    originY;
		(float)renderSize.x(),      // float    width;
		(float)renderSize.y(),      // float    height;
		0.0f,                       // float    minDepth;
		1.0f                        // float    maxDepth;
	};
	const VkRect2D scissor =
	{
		{ 0, 0 },                                                       // VkOffset2D  offset;
		{ renderSize.x(), renderSize.y() }                              // VkExtent2D  extent;
	};
	const VkPipelineViewportStateCreateInfo viewportStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,          // VkStructureType                      sType;
		DE_NULL,                                                        // const void*                          pNext;
		0u,                                                             // VkPipelineViewportStateCreateFlags   flags;
		1u,                                                             // deUint32                             viewportCount;
		&viewport,                                                      // const VkViewport*                    pViewports;
		1u,                                                             // deUint32                             scissorCount;
		&scissor                                                        // const VkRect2D*                      pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo rasterStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,     // VkStructureType                          sType;
		DE_NULL,                                                        // const void*                              pNext;
		0u,                                                             // VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,                                                       // VkBool32                                 depthClampEnable;
		VK_FALSE,                                                       // VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,                                           // VkPolygonMode                            polygonMode;
		VK_CULL_MODE_NONE,                                              // VkCullModeFlags                          cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,                                // VkFrontFace                              frontFace;
		VK_FALSE,                                                       // VkBool32                                 depthBiasEnable;
		0.0f,                                                           // float                                    depthBiasConstantFactor;
		0.0f,                                                           // float                                    depthBiasClamp;
		0.0f,                                                           // float                                    depthBiasSlopeFactor;
		1.0f,                                                           // float                                    lineWidth;
	};

	const VkPipelineColorBlendAttachmentState colorBlendAttachmentState =
	{
		VK_FALSE,                                                                   // VkBool32                 blendEnable;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstColorBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                colorBlendOp;
		VK_BLEND_FACTOR_ONE,                                                        // VkBlendFactor            srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,                                                       // VkBlendFactor            dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,                                                            // VkBlendOp                alphaBlendOp;
		VK_COLOR_COMPONENT_R_BIT |
		VK_COLOR_COMPONENT_G_BIT |
		VK_COLOR_COMPONENT_B_BIT |
		VK_COLOR_COMPONENT_A_BIT                                                    // VkColorComponentFlags    colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo colorBlendStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,   // VkStructureType                              sType;
		DE_NULL,                                                    // const void*                                  pNext;
		0u,                                                         // VkPipelineColorBlendStateCreateFlags         flags;
		VK_FALSE,                                                   // VkBool32                                     logicOpEnable;
		VK_LOGIC_OP_COPY,                                           // VkLogicOp                                    logicOp;
		1u,                                                         // deUint32                                     attachmentCount;
		&colorBlendAttachmentState,                                 // const VkPipelineColorBlendAttachmentState*   pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },                                 // float                                        blendConst[4];
	};

	const VkPipelineMultisampleStateCreateInfo  multisampleStateParams  =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,   // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineMultisampleStateCreateFlags    flags;
		VK_SAMPLE_COUNT_1_BIT,                                      // VkSampleCountFlagBits                    rasterizationSamples;
		VK_FALSE,                                                   // VkBool32                                 sampleShadingEnable;
		0.0f,                                                       // float                                    minSampleShading;
		DE_NULL,                                                    // const VkSampleMask*                      pSampleMask;
		VK_FALSE,                                                   // VkBool32                                 alphaToCoverageEnable;
		VK_FALSE,                                                   // VkBool32                                 alphaToOneEnable;
	};

	VkPipelineDepthStencilStateCreateInfo depthStencilStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO, // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineDepthStencilStateCreateFlags   flags;
		VK_TRUE,                                                    // VkBool32                                 depthTestEnable;
		VK_TRUE,                                                    // VkBool32                                 depthWriteEnable;
		VK_COMPARE_OP_LESS_OR_EQUAL,                                // VkCompareOp                              depthCompareOp;
		VK_FALSE,                                                   // VkBool32                                 depthBoundsTestEnable;
		VK_FALSE,                                                   // VkBool32                                 stencilTestEnable;
		// VkStencilOpState front;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		// VkStencilOpState back;
		{
			VK_STENCIL_OP_KEEP,     // VkStencilOp  failOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  passOp;
			VK_STENCIL_OP_KEEP,     // VkStencilOp  depthFailOp;
			VK_COMPARE_OP_NEVER,    // VkCompareOp  compareOp;
			0u,                     // deUint32     compareMask;
			0u,                     // deUint32     writeMask;
			0u,                     // deUint32     reference;
		},
		0.0f,                                                      // float                                    minDepthBounds;
		1.0f,                                                      // float                                    maxDepthBounds;
	};

	const VkPipelineTessellationStateCreateInfo tessStateCreateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,  // VkStructureType                          sType;
		DE_NULL,                                                    // const void*                              pNext;
		0u,                                                         // VkPipelineTesselationStateCreateFlags    flags;
		m_patchControlPoints,                                       // deUint32                                 patchControlPoints;
	};
	const VkPipelineTessellationStateCreateInfo* pTessCreateInfo = (m_patchControlPoints > 0)
																  ? &tessStateCreateInfo
																  : DE_NULL;

	const VkGraphicsPipelineCreateInfo graphicsPipelineParams =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,    // VkStructureType                                  sType;
		DE_NULL,                                            // const void*                                      pNext;
		0u,                                                 // VkPipelineCreateFlags                            flags;
		m_shaderStageCount,                                 // deUint32                                         stageCount;
		m_shaderStageInfo,                                  // const VkPipelineShaderStageCreateInfo*           pStages;
		&vertexInputStateParams,                            // const VkPipelineVertexInputStateCreateInfo*      pVertexInputState;
		&inputAssemblyStateParams,                          // const VkPipelineInputAssemblyStateCreateInfo*    pInputAssemblyState;
		pTessCreateInfo,                                    // const VkPipelineTessellationStateCreateInfo*     pTessellationState;
		&viewportStateParams,                               // const VkPipelineViewportStateCreateInfo*         pViewportState;
		&rasterStateParams,                                 // const VkPipelineRasterizationStateCreateInfo*    pRasterState;
		&multisampleStateParams,                            // const VkPipelineMultisampleStateCreateInfo*      pMultisampleState;
		&depthStencilStateParams,                           // const VkPipelineDepthStencilStateCreateInfo*     pDepthStencilState;
		&colorBlendStateParams,                             // const VkPipelineColorBlendStateCreateInfo*       pColorBlendState;
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,   // const VkPipelineDynamicStateCreateInfo*          pDynamicState;
		pipelineLayout,                                     // VkPipelineLayout                                 layout;
		renderPass,                                         // VkRenderPass                                     renderPass;
		0u,                                                 // deUint32                                         subpass;
		0u,                                                 // VkPipeline                                       basePipelineHandle;
		0,                                                  // deInt32                                          basePipelineIndex;
	};

	return createGraphicsPipeline(vk, vkDevice, cache, &graphicsPipelineParams);
}